

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::operator=(TiXmlDeclaration *this,TiXmlDeclaration *copy)

{
  TiXmlNode *pTVar1;
  TiXmlBase *pTVar2;
  
  pTVar1 = (this->super_TiXmlNode).firstChild;
  while (pTVar1 != (TiXmlNode *)0x0) {
    pTVar2 = &pTVar1->super_TiXmlBase;
    pTVar1 = pTVar1->next;
    (*pTVar2->_vptr_TiXmlBase[1])();
  }
  (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
  (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
  CopyTo(copy,this);
  return;
}

Assistant:

void TiXmlDeclaration::operator=(const TiXmlDeclaration& copy) {
	Clear();
	copy.CopyTo(this);
}